

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O1

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  pointer puVar1;
  Pass *pPVar2;
  Module *this_00;
  ostream *poVar3;
  PassRunner *pPVar4;
  PassRunner *pPVar5;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar6;
  bool bVar7;
  string_view sVar8;
  Name name_00;
  undefined1 local_1f0 [8];
  PassRunner postRunner;
  string local_68;
  Module *local_48;
  Module *local_40;
  PassRunner *local_38;
  
  pPVar4 = name.super_IString.str._M_len;
  pPVar5 = pPVar4;
  local_38 = (PassRunner *)this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"extracting ",0xb);
  name_00.super_IString.str._M_str = (char *)pPVar5;
  name_00.super_IString.str._M_len = (size_t)pPVar4;
  local_40 = module;
  poVar3 = operator<<((wasm *)&std::cerr,(ostream *)module,name_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  puVar6 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = (Module *)runner;
  if (puVar6 != puVar1) {
    bVar7 = false;
    do {
      if (((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->runner == pPVar4) {
        bVar7 = true;
      }
      else {
        sVar8 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xb74b22),SUB81(pPVar5,0));
        *(string_view *)
         &(((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length = sVar8
        ;
        pPVar2 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
        pPVar5 = pPVar2->runner;
        *(_func_int ***)((long)&(pPVar2->name).field_2 + 8) = pPVar2->_vptr_Pass;
        pPVar2[1]._vptr_Pass = (_func_int **)pPVar5;
        pPVar2 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
        pPVar5 = (PassRunner *)pPVar2[1].name._M_string_length;
        if ((PassRunner *)pPVar2[1].name.field_2._M_allocated_capacity != pPVar5) {
          pPVar2[1].name.field_2._M_allocated_capacity = (size_type)pPVar5;
        }
        (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl[2]._vptr_Pass = (_func_int **)0x0;
      }
      this_00 = local_48;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    if (bVar7) {
      std::
      vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ::_M_erase_at_end(&local_48->exports,
                        (local_48->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      Module::updateMaps(this_00);
      local_1f0 = (undefined1  [8])operator_new(0x28);
      (((Export *)local_1f0)->name).super_IString.str._M_len = 0;
      (((Export *)local_1f0)->name).super_IString.str._M_str = (char *)0x0;
      (((Export *)local_1f0)->value).super_IString.str._M_len = 0;
      (((Export *)local_1f0)->value).super_IString.str._M_str = (char *)0x0;
      *(undefined8 *)&((Export *)local_1f0)->kind = 0;
      (((Export *)local_1f0)->name).super_IString.str._M_len = (size_t)local_40;
      (((Export *)local_1f0)->name).super_IString.str._M_str = (char *)pPVar4;
      (((Export *)local_1f0)->value).super_IString.str._M_len = (size_t)local_40;
      (((Export *)local_1f0)->value).super_IString.str._M_str = (char *)pPVar4;
      ((Export *)local_1f0)->kind = Function;
      Module::addExport(this_00,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                                local_1f0);
      if (local_1f0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f0,0x28);
      }
      PassRunner::PassRunner((PassRunner *)local_1f0,local_38);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"remove-unused-module-elements","");
      PassRunner::add((PassRunner *)local_1f0,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      PassRunner::run((PassRunner *)local_1f0);
      PassRunner::~PassRunner((PassRunner *)local_1f0);
      return;
    }
  }
  Fatal::Fatal((Fatal *)local_1f0);
  Fatal::operator<<((Fatal *)local_1f0,(char (*) [40])"could not find the function to extract\n");
  Fatal::~Fatal((Fatal *)local_1f0);
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}